

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

CompilerGLSL * __thiscall
spirv_cross::CompilerGLSL::to_flattened_access_chain_expression_abi_cxx11_
          (CompilerGLSL *this,uint32_t id)

{
  uint32_t uVar1;
  uint32_t in_EDX;
  undefined4 in_register_00000034;
  Compiler *this_00;
  undefined1 local_80 [40];
  SPIRExpression *expr;
  SPIRVariable *local_28;
  SPIRVariable *var;
  Compiler *pCStack_18;
  uint32_t id_local;
  CompilerGLSL *this_local;
  string *basename;
  
  this_00 = (Compiler *)CONCAT44(in_register_00000034,id);
  var._3_1_ = 0;
  var._4_4_ = in_EDX;
  pCStack_18 = this_00;
  this_local = this;
  ::std::__cxx11::string::string((string *)this);
  local_28 = Compiler::maybe_get<spirv_cross::SPIRVariable>(this_00,var._4_4_);
  if (local_28 == (SPIRVariable *)0x0) {
    local_80._32_8_ = Compiler::maybe_get<spirv_cross::SPIRExpression>(this_00,var._4_4_);
    if ((SPIRExpression *)local_80._32_8_ == (SPIRExpression *)0x0) {
      to_expression_abi_cxx11_((CompilerGLSL *)local_80,id,SUB41(var._4_4_,0));
      ::std::__cxx11::string::operator=((string *)this,(string *)local_80);
      ::std::__cxx11::string::~string((string *)local_80);
    }
    else {
      ::std::__cxx11::string::operator=
                ((string *)this,(string *)&((SPIRExpression *)local_80._32_8_)->expression);
    }
  }
  else {
    uVar1 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(local_28->super_IVariant).self);
    (*this_00->_vptr_Compiler[6])(&expr,this_00,(ulong)uVar1,1);
    ::std::__cxx11::string::operator=((string *)this,(string *)&expr);
    ::std::__cxx11::string::~string((string *)&expr);
  }
  return this;
}

Assistant:

std::string CompilerGLSL::to_flattened_access_chain_expression(uint32_t id)
{
	// Do not use to_expression as that will unflatten access chains.
	string basename;
	if (const auto *var = maybe_get<SPIRVariable>(id))
		basename = to_name(var->self);
	else if (const auto *expr = maybe_get<SPIRExpression>(id))
		basename = expr->expression;
	else
		basename = to_expression(id);

	return basename;
}